

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_negate(secp256k1_context *ctx,secp256k1_pubkey *pubkey)

{
  void *in_RSI;
  secp256k1_ge p;
  int ret;
  secp256k1_ge *in_stack_ffffffffffffff88;
  secp256k1_ge *in_stack_ffffffffffffff90;
  secp256k1_ge *in_stack_ffffffffffffffc8;
  secp256k1_ge *in_stack_ffffffffffffffd0;
  secp256k1_context *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else {
    local_4 = secp256k1_pubkey_load
                        (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         (secp256k1_pubkey *)in_stack_ffffffffffffffc8);
    memset(in_RSI,0,0x40);
    if (local_4 != 0) {
      secp256k1_ge_neg(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      secp256k1_pubkey_save((secp256k1_pubkey *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
      ;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ec_pubkey_negate(const secp256k1_context* ctx, secp256k1_pubkey *pubkey) {
    int ret = 0;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);

    ret = secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        secp256k1_ge_neg(&p, &p);
        secp256k1_pubkey_save(pubkey, &p);
    }
    return ret;
}